

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall kj::str<unsigned_int&>(String *__return_storage_ptr__,kj *this,uint *params)

{
  kj *this_00;
  uint *value;
  CappedArray<char,_14UL> *params_00;
  CappedArray<char,_14UL> local_30;
  kj *local_18;
  uint *params_local;
  
  local_18 = this;
  params_local = (uint *)__return_storage_ptr__;
  this_00 = (kj *)fwd<unsigned_int&>((uint *)this);
  toCharSequence<unsigned_int&>(&local_30,this_00,value);
  _::concat<kj::CappedArray<char,14ul>>(__return_storage_ptr__,(_ *)&local_30,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}